

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O0

void Abc_NtkSetDefaultFxParams(Fxu_Data_t *p)

{
  Fxu_Data_t *p_local;
  
  memset(p,0,0x60);
  p->nSingleMax = 20000;
  p->nPairsMax = 30000;
  p->nNodesExt = 1000000;
  p->WeightMin = 0;
  p->LitCountMax = 0;
  p->fOnlyS = 0;
  p->fOnlyD = 0;
  p->fUse0 = 0;
  p->fUseCompl = 1;
  p->fVerbose = 0;
  return;
}

Assistant:

void Abc_NtkSetDefaultFxParams( Fxu_Data_t * p )
{
    memset( p, 0, sizeof(Fxu_Data_t) );
    p->nSingleMax =  20000;
    p->nPairsMax  =  30000;
    p->nNodesExt  =1000000;
    p->WeightMin  =      0;
    p->LitCountMax=      0;
    p->fOnlyS     =      0;
    p->fOnlyD     =      0;
    p->fUse0      =      0;
    p->fUseCompl  =      1;
    p->fVerbose   =      0;
}